

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcPrePartialsPartials
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long in_RCX;
  ulong *puVar8;
  long in_RDX;
  long in_RSI;
  double *in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double MjPj;
  int in_stack_00000010;
  int j;
  double sum2B;
  double sum2A;
  double *matrices2Ptr;
  double *matrices1Ptr;
  int i;
  int k;
  double *destPtr;
  double *partials2Ptr;
  double *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  double *tmpdestPtr;
  int stateCountModFour;
  int matrixIncr;
  double *in_stack_ffffffffffffff60;
  int local_94;
  double local_90;
  double local_88;
  int local_70;
  int local_6c;
  ulong *local_68;
  long local_60;
  long local_58;
  int local_48;
  ulong *local_40;
  
  iVar6 = *(int *)((long)in_RDI + 0x24) + 1;
  iVar7 = *(int *)((long)in_RDI + 0x24) / 4 << 2;
  std::fill<double*,int>(in_stack_ffffffffffffff60,in_RDI,(int *)0x1a3d9c);
  for (local_48 = 0; local_48 < *(int *)((long)in_RDI + 0x34); local_48 = local_48 + 1) {
    iVar3 = local_48 * *(int *)((long)in_RDI + 0x2c) * *(int *)((long)in_RDI + 0x14) +
            *(int *)((long)in_RDI + 0x2c) * MjPj._0_4_;
    iVar1 = *(int *)(in_RDI + 8);
    local_58 = in_RDX + (long)iVar3 * 8;
    local_60 = in_R8 + (long)iVar3 * 8;
    local_68 = (ulong *)(in_RSI + (long)iVar3 * 8);
    for (local_6c = MjPj._0_4_; local_6c < in_stack_00000010; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < *(int *)((long)in_RDI + 0x24); local_70 = local_70 + 1) {
        lVar4 = in_RCX + (long)(local_48 * iVar1) * 8 + (long)(local_70 * iVar6) * 8;
        lVar5 = in_R9 + (long)(local_48 * iVar1) * 8 + (long)(local_70 * iVar6) * 8;
        local_88 = 0.0;
        local_90 = 0.0;
        for (local_94 = 0; local_94 < iVar7; local_94 = local_94 + 4) {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(lVar5 + (long)local_94 * 8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(local_60 + (long)local_94 * 8);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_88;
          auVar9 = vfmadd213sd_fma(auVar9,auVar19,auVar29);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(lVar5 + (long)(local_94 + 1) * 8);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(local_60 + (long)(local_94 + 1) * 8);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_90;
          auVar10 = vfmadd213sd_fma(auVar10,auVar20,auVar30);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar5 + (long)(local_94 + 2) * 8);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(local_60 + (long)(local_94 + 2) * 8);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = auVar9._0_8_;
          auVar9 = vfmadd213sd_fma(auVar11,auVar21,auVar31);
          local_88 = auVar9._0_8_;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(lVar5 + (long)(local_94 + 3) * 8);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(local_60 + (long)(local_94 + 3) * 8);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = auVar10._0_8_;
          auVar9 = vfmadd213sd_fma(auVar12,auVar22,auVar32);
          local_90 = auVar9._0_8_;
        }
        for (; local_94 < *(int *)((long)in_RDI + 0x24); local_94 = local_94 + 1) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(lVar5 + (long)local_94 * 8);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(local_60 + (long)local_94 * 8);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_88;
          auVar9 = vfmadd213sd_fma(auVar13,auVar23,auVar33);
          local_88 = auVar9._0_8_;
        }
        local_40 = local_68;
        dVar2 = (local_88 + local_90) * *(double *)(local_58 + (long)local_70 * 8);
        for (local_94 = 0; local_94 < iVar7; local_94 = local_94 + 4) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar4 + (long)local_94 * 8);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = dVar2;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *local_40;
          auVar9 = vfmadd213sd_fma(auVar14,auVar24,auVar34);
          *local_40 = auVar9._0_8_;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(ulong *)(lVar4 + (long)(local_94 + 1) * 8);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar2;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_40[1];
          auVar9 = vfmadd213sd_fma(auVar15,auVar25,auVar35);
          local_40[1] = auVar9._0_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(lVar4 + (long)(local_94 + 2) * 8);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar2;
          puVar8 = local_40 + 3;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_40[2];
          auVar9 = vfmadd213sd_fma(auVar16,auVar26,auVar36);
          local_40[2] = auVar9._0_8_;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(lVar4 + (long)(local_94 + 3) * 8);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar2;
          local_40 = local_40 + 4;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *puVar8;
          auVar9 = vfmadd213sd_fma(auVar17,auVar27,auVar37);
          *puVar8 = auVar9._0_8_;
        }
        for (; local_94 < *(int *)((long)in_RDI + 0x24); local_94 = local_94 + 1) {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(lVar4 + (long)local_94 * 8);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar2;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *local_40;
          auVar9 = vfmadd213sd_fma(auVar18,auVar28,auVar38);
          *local_40 = auVar9._0_8_;
          local_40 = local_40 + 1;
        }
      }
      local_68 = local_68 + *(int *)((long)in_RDI + 0x2c);
      local_58 = local_58 + (long)*(int *)((long)in_RDI + 0x2c) * 8;
      local_60 = local_60 + (long)*(int *)((long)in_RDI + 0x2c) * 8;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                const REALTYPE* partials1,
                                                                const REALTYPE* matrices1,
                                                                const REALTYPE* partials2,
                                                                const REALTYPE* matrices2,
                                                                int startPattern,
                                                                int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum2A = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                // sum2A + sum2B = M_j P_j
                // Now 2nd loop
                tmpdestPtr = destPtr;
                REALTYPE  MjPj = (sum2A + sum2B) * partials1Ptr[i];

                for (j = 0; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }

}